

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

mg_value * mg_value_copy_ca(mg_value *val,mg_allocator *allocator)

{
  mg_value_type mVar1;
  mg_value *buf;
  mg_path *pmVar2;
  
  if ((val != (mg_value *)0x0) &&
     (buf = (mg_value *)mg_allocator_malloc(allocator,0x10), buf != (mg_value *)0x0)) {
    mVar1 = val->type;
    buf->type = mVar1;
    switch(mVar1) {
    case MG_VALUE_TYPE_BOOL:
      (buf->field_1).bool_v = (val->field_1).bool_v;
      return buf;
    case MG_VALUE_TYPE_INTEGER:
      buf->field_1 = val->field_1;
      return buf;
    case MG_VALUE_TYPE_FLOAT:
      buf->field_1 = val->field_1;
      return buf;
    case MG_VALUE_TYPE_STRING:
      pmVar2 = (mg_path *)mg_string_copy_ca((val->field_1).string_v,allocator);
      break;
    case MG_VALUE_TYPE_LIST:
      pmVar2 = (mg_path *)mg_list_copy_ca((val->field_1).list_v,allocator);
      break;
    case MG_VALUE_TYPE_MAP:
      pmVar2 = (mg_path *)mg_map_copy_ca((val->field_1).map_v,allocator);
      break;
    case MG_VALUE_TYPE_NODE:
      pmVar2 = (mg_path *)mg_node_copy_ca((val->field_1).node_v,allocator);
      break;
    case MG_VALUE_TYPE_RELATIONSHIP:
      pmVar2 = (mg_path *)mg_relationship_copy_ca((val->field_1).relationship_v,allocator);
      break;
    case MG_VALUE_TYPE_UNBOUND_RELATIONSHIP:
      pmVar2 = (mg_path *)
               mg_unbound_relationship_copy_ca((val->field_1).unbound_relationship_v,allocator);
      break;
    case MG_VALUE_TYPE_PATH:
      pmVar2 = mg_path_copy_ca((val->field_1).path_v,allocator);
      break;
    case MG_VALUE_TYPE_DATE:
      pmVar2 = (mg_path *)mg_date_copy_ca((val->field_1).date_v,allocator);
      break;
    case MG_VALUE_TYPE_TIME:
      pmVar2 = (mg_path *)mg_time_copy_ca((val->field_1).time_v,allocator);
      break;
    case MG_VALUE_TYPE_LOCAL_TIME:
      pmVar2 = (mg_path *)mg_local_time_copy_ca((val->field_1).local_time_v,allocator);
      break;
    case MG_VALUE_TYPE_DATE_TIME:
      pmVar2 = (mg_path *)mg_date_time_copy_ca((val->field_1).date_time_v,allocator);
      break;
    case MG_VALUE_TYPE_DATE_TIME_ZONE_ID:
      pmVar2 = (mg_path *)mg_date_time_zone_id_copy_ca((val->field_1).date_time_zone_id_v,allocator)
      ;
      break;
    case MG_VALUE_TYPE_LOCAL_DATE_TIME:
      pmVar2 = (mg_path *)mg_local_date_time_copy_ca((val->field_1).local_date_time_v,allocator);
      break;
    case MG_VALUE_TYPE_DURATION:
      pmVar2 = (mg_path *)mg_duration_copy_ca((val->field_1).duration_v,allocator);
      break;
    case MG_VALUE_TYPE_POINT_2D:
      pmVar2 = (mg_path *)mg_point_2d_copy_ca((val->field_1).point_2d_v,allocator);
      break;
    case MG_VALUE_TYPE_POINT_3D:
      pmVar2 = (mg_path *)mg_point_3d_copy_ca((val->field_1).point_3d_v,allocator);
      break;
    default:
      return buf;
    }
    (buf->field_1).point_3d_v = (mg_point_3d *)pmVar2;
    if (pmVar2 != (mg_path *)0x0) {
      return buf;
    }
    mg_allocator_free(&mg_system_allocator,buf);
  }
  return (mg_value *)0x0;
}

Assistant:

mg_value *mg_value_copy_ca(const mg_value *val, mg_allocator *allocator) {
  if (!val) {
    return NULL;
  }
  mg_value *new_val = mg_allocator_malloc(allocator, sizeof(mg_value));
  if (!new_val) {
    return NULL;
  }
  new_val->type = val->type;
  switch (val->type) {
    case MG_VALUE_TYPE_NULL:
      break;
    case MG_VALUE_TYPE_BOOL:
      new_val->bool_v = val->bool_v;
      break;
    case MG_VALUE_TYPE_INTEGER:
      new_val->integer_v = val->integer_v;
      break;
    case MG_VALUE_TYPE_FLOAT:
      new_val->float_v = val->float_v;
      break;
    case MG_VALUE_TYPE_STRING:
      new_val->string_v = mg_string_copy_ca(val->string_v, allocator);
      if (!new_val->string_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_LIST:
      new_val->list_v = mg_list_copy_ca(val->list_v, allocator);
      if (!new_val->list_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_MAP:
      new_val->map_v = mg_map_copy_ca(val->map_v, allocator);
      if (!new_val->map_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_NODE:
      new_val->node_v = mg_node_copy_ca(val->node_v, allocator);
      if (!new_val->node_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_RELATIONSHIP:
      new_val->relationship_v =
          mg_relationship_copy_ca(val->relationship_v, allocator);
      if (!new_val->relationship_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_UNBOUND_RELATIONSHIP:
      new_val->unbound_relationship_v = mg_unbound_relationship_copy_ca(
          val->unbound_relationship_v, allocator);
      if (!new_val->unbound_relationship_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_PATH:
      new_val->path_v = mg_path_copy_ca(val->path_v, allocator);
      if (!new_val->path_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_DATE:
      new_val->date_v = mg_date_copy_ca(val->date_v, allocator);
      if (!new_val->date_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_TIME:
      new_val->time_v = mg_time_copy_ca(val->time_v, allocator);
      if (!new_val->time_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_LOCAL_TIME:
      new_val->local_time_v =
          mg_local_time_copy_ca(val->local_time_v, allocator);
      if (!new_val->local_time_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_DATE_TIME:
      new_val->date_time_v = mg_date_time_copy_ca(val->date_time_v, allocator);
      if (!new_val->date_time_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_DATE_TIME_ZONE_ID:
      new_val->date_time_zone_id_v =
          mg_date_time_zone_id_copy_ca(val->date_time_zone_id_v, allocator);
      if (!new_val->date_time_zone_id_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_LOCAL_DATE_TIME:
      new_val->local_date_time_v =
          mg_local_date_time_copy_ca(val->local_date_time_v, allocator);
      if (!new_val->local_date_time_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_DURATION:
      new_val->duration_v = mg_duration_copy_ca(val->duration_v, allocator);
      if (!new_val->duration_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_POINT_2D:
      new_val->point_2d_v = mg_point_2d_copy_ca(val->point_2d_v, allocator);
      if (!new_val->point_2d_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_POINT_3D:
      new_val->point_3d_v = mg_point_3d_copy_ca(val->point_3d_v, allocator);
      if (!new_val->point_3d_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_UNKNOWN:
      break;
  }
  return new_val;

cleanup:
  mg_allocator_free(&mg_system_allocator, new_val);
  return NULL;
}